

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Error doContent(XML_Parser parser,int startTagLevel,ENCODING *enc,char *s,char *end,
                   char **nextPtr,XML_Bool haveMore)

{
  XML_Parsing XVar1;
  XML_CharacterDataHandler p_Var2;
  void *pvVar3;
  block *pbVar4;
  DTD *pDVar5;
  int iVar6;
  XML_Convert_Result XVar7;
  int iVar8;
  XML_Error XVar9;
  STRING_POOL *pSVar10;
  TAG *pTVar11;
  XML_Char *pXVar12;
  ENTITY *entity;
  char *pcVar13;
  STRING_POOL *pSVar14;
  BLOCK *pBVar15;
  XML_Bool betweenDecl;
  BLOCK *pBVar16;
  BINDING *b;
  char *pcVar17;
  OPEN_INTERNAL_ENTITY *pOVar18;
  char cVar19;
  size_t sVar20;
  BINDING *pBVar21;
  bool bVar22;
  bool bVar23;
  char *next;
  char *fromPtr;
  XML_Char *toPtr;
  XML_Error local_cc;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  OPEN_INTERNAL_ENTITY *local_b0;
  int local_a4;
  char **local_a0;
  BINDING *local_98;
  TAG_NAME local_90;
  XML_Char **local_68;
  char **local_60;
  TAG_NAME *local_58;
  STRING_POOL *local_50;
  DTD *local_48;
  STRING_POOL *local_40;
  BINDING **local_38;
  
  local_48 = parser->m_dtd;
  if (parser->m_encoding == enc) {
    pOVar18 = (OPEN_INTERNAL_ENTITY *)&parser->m_eventPtr;
    local_a0 = &parser->m_eventEndPtr;
  }
  else {
    pOVar18 = parser->m_openInternalEntities;
    local_a0 = &pOVar18->internalEventEndPtr;
  }
  pOVar18->internalEventPtr = s;
  local_50 = &parser->m_tempPool;
  local_68 = &(parser->m_tempPool).end;
  local_40 = &local_48->pool;
  pSVar10 = local_40;
  local_c8 = s;
  local_b8 = end;
  local_b0 = pOVar18;
  local_a4 = startTagLevel;
  local_60 = nextPtr;
  do {
    local_cc = (XML_Error)pSVar10;
    local_c0 = local_c8;
    iVar6 = (*enc->scanners[1])(enc,local_c8,end,&local_c0);
    *local_a0 = local_c0;
    switch(iVar6) {
    case 0:
      pOVar18->internalEventPtr = local_c0;
      pSVar14 = (STRING_POOL *)&DAT_00000004;
      goto LAB_0045c579;
    case 1:
    case 2:
      pTVar11 = parser->m_freeTagList;
      if (pTVar11 == (TAG *)0x0) {
        pTVar11 = (TAG *)(*(parser->m_mem).malloc_fcn)(0x58);
        if (pTVar11 != (TAG *)0x0) {
          pcVar17 = (char *)(*(parser->m_mem).malloc_fcn)(0x20);
          pTVar11->buf = pcVar17;
          if (pcVar17 != (char *)0x0) {
            pTVar11->bufEnd = pcVar17 + 0x20;
            goto LAB_0045b8c0;
          }
          (*(parser->m_mem).free_fcn)(pTVar11);
        }
        pSVar14 = (STRING_POOL *)0x1;
LAB_0045c188:
        bVar23 = false;
        pOVar18 = local_b0;
      }
      else {
        parser->m_freeTagList = pTVar11->parent;
LAB_0045b8c0:
        local_38 = &pTVar11->bindings;
        pTVar11->bindings = (BINDING *)0x0;
        pTVar11->parent = parser->m_tagStack;
        parser->m_tagStack = pTVar11;
        local_58 = &pTVar11->name;
        (pTVar11->name).localPart = (XML_Char *)0x0;
        (pTVar11->name).prefix = (XML_Char *)0x0;
        iVar6 = enc->minBytesPerChar;
        pTVar11->rawName = local_c8 + iVar6;
        iVar6 = (*enc->nameLength)(enc,local_c8 + iVar6);
        pTVar11->rawNameLength = iVar6;
        parser->m_tagLevel = parser->m_tagLevel + 1;
        local_98 = (BINDING *)pTVar11->rawName;
        pBVar21 = (BINDING *)((long)&local_98->prefix + (long)iVar6);
        local_90.str = pTVar11->buf;
        do {
          XVar7 = (*enc->utf8Convert)(enc,(char **)&local_98,(char *)pBVar21,&local_90.str,
                                      pTVar11->bufEnd + -1);
          iVar6 = (int)pTVar11->buf;
          iVar8 = (int)local_90.str - iVar6;
          if ((local_98 < pBVar21) && (XVar7 != XML_CONVERT_INPUT_INCOMPLETE)) {
            sVar20 = (size_t)((*(int *)&pTVar11->bufEnd - iVar6) * 2);
            pcVar17 = (char *)(*(parser->m_mem).realloc_fcn)(pTVar11->buf,sVar20);
            iVar6 = 0;
            if (pcVar17 == (char *)0x0) {
              iVar6 = 1;
              bVar23 = false;
              local_cc = XML_ERROR_NO_MEMORY;
            }
            else {
              pTVar11->buf = pcVar17;
              pTVar11->bufEnd = pcVar17 + sVar20;
              local_90.str = pcVar17 + iVar8;
              bVar23 = true;
            }
          }
          else {
            (pTVar11->name).strLen = iVar8;
            iVar6 = 5;
            bVar23 = false;
          }
          nextPtr = local_60;
          end = local_b8;
        } while (iVar6 == 0);
        if ((iVar6 == 5) || (bVar23)) {
          (pTVar11->name).str = pTVar11->buf;
          *local_90.str = '\0';
          XVar9 = storeAtts(parser,enc,local_c8,local_58,local_38);
          pOVar18 = local_b0;
          pSVar14 = (STRING_POOL *)(ulong)XVar9;
          if (XVar9 != XML_ERROR_NONE) goto LAB_0045c188;
          if (parser->m_startElementHandler == (XML_StartElementHandler)0x0) {
            if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
              reportDefault(parser,enc,local_c8,local_c0);
            }
          }
          else {
            (*parser->m_startElementHandler)
                      (parser->m_handlerArg,local_58->str,&parser->m_atts->name);
          }
          pBVar16 = (parser->m_tempPool).blocks;
          pBVar15 = (parser->m_tempPool).freeBlocks;
          if (pBVar15 == (BLOCK *)0x0) {
LAB_0045c1df:
            (parser->m_tempPool).freeBlocks = pBVar16;
          }
          else {
            pbVar4 = pBVar16;
            if (pBVar16 != (BLOCK *)0x0) {
              do {
                pBVar16 = pbVar4;
                pbVar4 = pBVar16->next;
                pBVar16->next = pBVar15;
                pBVar15 = pBVar16;
              } while (pbVar4 != (block *)0x0);
              goto LAB_0045c1df;
            }
          }
          (parser->m_tempPool).blocks = (BLOCK *)0x0;
          local_68[2] = (XML_Char *)0x0;
          *local_68 = (XML_Char *)0x0;
          local_68[1] = (XML_Char *)0x0;
          bVar23 = true;
        }
        else {
          bVar23 = false;
          pOVar18 = local_b0;
        }
        pSVar14 = (STRING_POOL *)(ulong)local_cc;
      }
      goto LAB_0045c206;
    case 3:
    case 4:
      pcVar17 = local_c8 + enc->minBytesPerChar;
      local_98 = (BINDING *)0x0;
      iVar6 = (*enc->nameLength)(enc,pcVar17);
      local_90.str = poolStoreString(local_50,enc,pcVar17,pcVar17 + iVar6);
      cVar19 = '\x01';
      if (local_90.str == (XML_Char *)0x0) {
        bVar23 = false;
        pSVar14 = (STRING_POOL *)0x1;
      }
      else {
        (parser->m_tempPool).start = (parser->m_tempPool).ptr;
        XVar9 = storeAtts(parser,enc,local_c8,&local_90,&local_98);
        bVar23 = XVar9 == XML_ERROR_NONE;
        if (bVar23) {
          (parser->m_tempPool).start = (parser->m_tempPool).ptr;
          bVar22 = parser->m_startElementHandler == (XML_StartElementHandler)0x0;
          if (!bVar22) {
            (*parser->m_startElementHandler)
                      (parser->m_handlerArg,local_90.str,&parser->m_atts->name);
          }
          if (parser->m_endElementHandler != (XML_EndElementHandler)0x0) {
            if (parser->m_startElementHandler != (XML_StartElementHandler)0x0) {
              local_b0->internalEventPtr = *local_a0;
            }
            (*parser->m_endElementHandler)(parser->m_handlerArg,local_90.str);
            bVar22 = false;
          }
          if ((bVar22) && (parser->m_defaultHandler != (XML_DefaultHandler)0x0)) {
            reportDefault(parser,enc,local_c8,local_c0);
          }
          pBVar16 = (parser->m_tempPool).blocks;
          pBVar15 = (parser->m_tempPool).freeBlocks;
          if (pBVar15 == (BLOCK *)0x0) {
LAB_0045c0e8:
            (parser->m_tempPool).freeBlocks = pBVar16;
          }
          else {
            pbVar4 = pBVar16;
            if (pBVar16 != (BLOCK *)0x0) {
              do {
                pBVar16 = pbVar4;
                pbVar4 = pBVar16->next;
                pBVar16->next = pBVar15;
                pBVar15 = pBVar16;
              } while (pbVar4 != (block *)0x0);
              goto LAB_0045c0e8;
            }
          }
          local_50->blocks = (BLOCK *)0x0;
          local_68[2] = (XML_Char *)0x0;
          *local_68 = (XML_Char *)0x0;
          local_68[1] = (XML_Char *)0x0;
          XVar9 = local_cc;
        }
        freeBindings(parser,local_98);
        pSVar14 = (STRING_POOL *)(ulong)XVar9;
      }
      pOVar18 = local_b0;
      end = local_b8;
      if (bVar23) {
        local_cc = (XML_Error)pSVar14;
        if ((parser->m_tagLevel == 0) &&
           (XVar1 = (parser->m_parsingStatus).parsing, XVar1 != XML_FINISHED)) {
          if (XVar1 != XML_SUSPENDED) {
            XVar9 = epilogProcessor(parser,local_c0,local_b8,nextPtr);
            pSVar14 = (STRING_POOL *)(ulong)XVar9;
            break;
          }
          parser->m_processor = epilogProcessor;
        }
        goto LAB_0045c548;
      }
      break;
    case 5:
      pSVar14 = (STRING_POOL *)0xd;
      cVar19 = '\x01';
      if (parser->m_tagLevel != local_a4) {
        pTVar11 = parser->m_tagStack;
        parser->m_tagStack = pTVar11->parent;
        pTVar11->parent = parser->m_freeTagList;
        parser->m_freeTagList = pTVar11;
        pcVar17 = local_c8 + (long)enc->minBytesPerChar * 2;
        iVar6 = (*enc->nameLength)(enc,pcVar17);
        if ((iVar6 == pTVar11->rawNameLength) &&
           (iVar6 = bcmp(pTVar11->rawName,pcVar17,(long)iVar6), iVar6 == 0)) {
          parser->m_tagLevel = parser->m_tagLevel + -1;
          if (parser->m_endElementHandler == (XML_EndElementHandler)0x0) {
            if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
              reportDefault(parser,enc,local_c8,local_c0);
            }
          }
          else {
            pcVar17 = (pTVar11->name).localPart;
            if (pcVar17 != (char *)0x0 && parser->m_ns != '\0') {
              pcVar13 = (pTVar11->name).str + (pTVar11->name).uriLen;
              cVar19 = *pcVar17;
              while (cVar19 != '\0') {
                pcVar17 = pcVar17 + 1;
                *pcVar13 = cVar19;
                pcVar13 = pcVar13 + 1;
                cVar19 = *pcVar17;
              }
              pcVar17 = (pTVar11->name).prefix;
              if (pcVar17 != (char *)0x0 && parser->m_ns_triplets != '\0') {
                *pcVar13 = parser->m_namespaceSeparator;
                cVar19 = *pcVar17;
                while (pcVar13 = pcVar13 + 1, cVar19 != '\0') {
                  pcVar17 = pcVar17 + 1;
                  *pcVar13 = cVar19;
                  cVar19 = *pcVar17;
                }
              }
              *pcVar13 = '\0';
            }
            (*parser->m_endElementHandler)(parser->m_handlerArg,(pTVar11->name).str);
          }
          while (pOVar18 = local_b0, end = local_b8, pBVar21 = pTVar11->bindings,
                pBVar21 != (BINDING *)0x0) {
            if (parser->m_endNamespaceDeclHandler != (XML_EndNamespaceDeclHandler)0x0) {
              (*parser->m_endNamespaceDeclHandler)(parser->m_handlerArg,pBVar21->prefix->name);
            }
            pTVar11->bindings = pTVar11->bindings->nextTagBinding;
            pBVar21->nextTagBinding = parser->m_freeBindingList;
            parser->m_freeBindingList = pBVar21;
            pBVar21->prefix->binding = pBVar21->prevPrefixBinding;
          }
          bVar23 = true;
          pSVar14 = (STRING_POOL *)((ulong)pSVar10 & 0xffffffff);
          if (parser->m_tagLevel == 0) {
            XVar9 = epilogProcessor(parser,local_c0,local_b8,nextPtr);
            goto LAB_0045bfbd;
          }
        }
        else {
          local_b0->internalEventPtr = pcVar17;
          pSVar14 = (STRING_POOL *)0x7;
          bVar23 = false;
          pOVar18 = local_b0;
          end = local_b8;
        }
        goto LAB_0045c206;
      }
      break;
    case 6:
      p_Var2 = parser->m_characterDataHandler;
      if (p_Var2 == (XML_CharacterDataHandler)0x0) {
        end = local_b8;
        if (parser->m_defaultHandler == (XML_DefaultHandler)0x0) goto LAB_0045c548;
        goto LAB_0045bf2e;
      }
      if (enc->isUtf8 == '\0') {
        while( true ) {
          local_90.str = parser->m_dataBuf;
          XVar7 = (*enc->utf8Convert)(enc,&local_c8,local_c0,&local_90.str,parser->m_dataBufEnd);
          *local_a0 = local_c8;
          (*p_Var2)(parser->m_handlerArg,parser->m_dataBuf,
                    (int)local_90.str - (int)parser->m_dataBuf);
          pOVar18 = local_b0;
          end = local_b8;
          if (XVar7 < XML_CONVERT_OUTPUT_EXHAUSTED) break;
          local_b0->internalEventPtr = local_c8;
        }
      }
      else {
        (*p_Var2)(parser->m_handlerArg,local_c8,(int)local_c0 - (int)local_c8);
        end = local_b8;
      }
      goto LAB_0045c548;
    case 7:
      if (parser->m_characterDataHandler != (XML_CharacterDataHandler)0x0) {
        local_90.str = (XML_Char *)CONCAT71(local_90.str._1_7_,10);
        (*parser->m_characterDataHandler)(parser->m_handlerArg,(XML_Char *)&local_90,1);
        goto LAB_0045c548;
      }
    default:
      if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
LAB_0045bf2e:
        reportDefault(parser,enc,local_c8,local_c0);
      }
      goto LAB_0045c548;
    case 8:
      if (parser->m_startCdataSectionHandler == (XML_StartCdataSectionHandler)0x0) {
        if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
          reportDefault(parser,enc,local_c8,local_c0);
        }
      }
      else {
        (*parser->m_startCdataSectionHandler)(parser->m_handlerArg);
      }
      XVar9 = doCdataSection(parser,enc,&local_c0,end,nextPtr,haveMore);
      if (XVar9 == XML_ERROR_NONE) {
        bVar23 = true;
        pSVar14 = (STRING_POOL *)((ulong)pSVar10 & 0xffffffff);
        if (local_c0 == (char *)0x0) {
          parser->m_processor = cdataSectionProcessor;
          bVar23 = false;
          pSVar14 = (STRING_POOL *)0x0;
        }
      }
      else {
LAB_0045bfbd:
        pSVar14 = (STRING_POOL *)(ulong)XVar9;
        bVar23 = false;
      }
LAB_0045c206:
      cVar19 = '\x01';
      local_cc = (XML_Error)pSVar14;
      if (bVar23) {
LAB_0045c548:
        local_c8 = local_c0;
        pOVar18->internalEventPtr = local_c0;
        XVar1 = (parser->m_parsingStatus).parsing;
        if (XVar1 == XML_FINISHED) {
          pSVar14 = (STRING_POOL *)0x23;
        }
        else {
          if (XVar1 != XML_SUSPENDED) {
            cVar19 = '\0';
            pSVar14 = (STRING_POOL *)(ulong)local_cc;
            break;
          }
LAB_0045c56c:
          *nextPtr = local_c8;
LAB_0045c570:
          pSVar14 = (STRING_POOL *)0x0;
        }
        goto LAB_0045c579;
      }
      break;
    case 9:
      iVar6 = (*enc->predefinedEntityName)
                        (enc,local_c8 + enc->minBytesPerChar,local_c0 + -(long)enc->minBytesPerChar)
      ;
      local_90.str = (XML_Char *)CONCAT71(local_90.str._1_7_,(char)iVar6);
      if ((char)iVar6 == '\0') {
        pXVar12 = poolStoreString(local_40,enc,local_c8 + enc->minBytesPerChar,
                                  local_c0 + -(long)enc->minBytesPerChar);
        pDVar5 = local_48;
        cVar19 = '\x01';
        if (pXVar12 == (XML_Char *)0x0) {
          pSVar14 = (STRING_POOL *)0x1;
          end = local_b8;
        }
        else {
          entity = (ENTITY *)lookup(parser,&local_48->generalEntities,pXVar12,0);
          pOVar18 = local_b0;
          end = local_b8;
          (pDVar5->pool).ptr = (pDVar5->pool).start;
          if ((pDVar5->hasParamEntityRefs == '\0') || (pDVar5->standalone != '\0')) {
            if (entity == (ENTITY *)0x0) {
              pSVar14 = (STRING_POOL *)0xb;
            }
            else {
              if (entity->is_internal != '\0') goto LAB_0045c3eb;
              pSVar14 = (STRING_POOL *)0x18;
            }
          }
          else if (entity == (ENTITY *)0x0) {
            if (parser->m_skippedEntityHandler == (XML_SkippedEntityHandler)0x0) {
              if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
                reportDefault(parser,enc,local_c8,local_c0);
              }
            }
            else {
              (*parser->m_skippedEntityHandler)(parser->m_handlerArg,pXVar12,0);
            }
            cVar19 = '\x04';
            pSVar14 = (STRING_POOL *)((ulong)pSVar10 & 0xffffffff);
            end = local_b8;
          }
          else {
LAB_0045c3eb:
            pSVar14 = (STRING_POOL *)&DAT_0000000c;
            if ((entity->open == '\0') &&
               (pSVar14 = (STRING_POOL *)0xf, entity->notation == (XML_Char *)0x0)) {
              if (entity->textPtr == (XML_Char *)0x0) {
                if (parser->m_externalEntityRefHandler == (XML_ExternalEntityRefHandler)0x0) {
                  if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
                    reportDefault(parser,enc,local_c8,local_c0);
                  }
                  goto LAB_0045c013;
                }
                entity->open = '\x01';
                pXVar12 = getContext(parser);
                entity->open = '\0';
                cVar19 = '\x01';
                if (pXVar12 == (XML_Char *)0x0) {
                  bVar23 = false;
                  pSVar14 = (STRING_POOL *)0x1;
                }
                else {
                  iVar6 = (*parser->m_externalEntityRefHandler)
                                    (parser->m_externalEntityRefHandlerArg,pXVar12,entity->base,
                                     entity->systemId,entity->publicId);
                  if (iVar6 == 0) {
                    pSVar14 = (STRING_POOL *)0x15;
                    bVar23 = false;
                  }
                  else {
                    (parser->m_tempPool).ptr = (parser->m_tempPool).start;
                    bVar23 = true;
                    pSVar14 = (STRING_POOL *)((ulong)pSVar10 & 0xffffffff);
                  }
                }
                local_cc = (XML_Error)pSVar14;
              }
              else {
                if (parser->m_defaultExpandInternalEntities == '\0') {
                  if (parser->m_skippedEntityHandler == (XML_SkippedEntityHandler)0x0) {
                    if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
                      reportDefault(parser,enc,local_c8,local_c0);
                    }
                  }
                  else {
                    (*parser->m_skippedEntityHandler)(parser->m_handlerArg,entity->name,0);
                  }
                  bVar23 = false;
                  cVar19 = '\x04';
                }
                else {
                  XVar9 = processInternalEntity(parser,entity,betweenDecl);
                  bVar23 = XVar9 == XML_ERROR_NONE;
                  cVar19 = !bVar23;
                  if (!bVar23) {
                    local_cc = XVar9;
                  }
                }
                pSVar14 = (STRING_POOL *)(ulong)local_cc;
                pOVar18 = local_b0;
              }
              if (bVar23) goto LAB_0045c013;
            }
          }
        }
      }
      else {
        if (parser->m_characterDataHandler == (XML_CharacterDataHandler)0x0) {
          if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
            reportDefault(parser,enc,local_c8,local_c0);
          }
        }
        else {
          (*parser->m_characterDataHandler)(parser->m_handlerArg,(XML_Char *)&local_90,1);
        }
LAB_0045c013:
        cVar19 = '\x04';
        pSVar14 = (STRING_POOL *)(ulong)local_cc;
      }
      local_cc = (XML_Error)pSVar14;
      if (cVar19 == '\x04') goto LAB_0045c548;
      break;
    case 10:
      iVar6 = (*enc->charRefNumber)(enc,local_c8);
      if (iVar6 < 0) {
        pSVar14 = (STRING_POOL *)0xe;
      }
      else {
        p_Var2 = parser->m_characterDataHandler;
        if (p_Var2 == (XML_CharacterDataHandler)0x0) {
          if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
            reportDefault(parser,enc,local_c8,local_c0);
          }
        }
        else {
          pvVar3 = parser->m_handlerArg;
          iVar8 = XmlUtf8Encode(iVar6,(char *)&local_90);
          end = local_b8;
          (*p_Var2)(pvVar3,(XML_Char *)&local_90,iVar8);
        }
        pSVar14 = (STRING_POOL *)((ulong)pSVar10 & 0xffffffff);
      }
      cVar19 = '\x01';
      local_cc = (XML_Error)pSVar14;
      pOVar18 = local_b0;
      if (-1 < iVar6) goto LAB_0045c548;
      break;
    case 0xb:
      iVar6 = reportProcessingInstruction(parser,enc,local_c8,local_c0);
      goto LAB_0045bd02;
    case 0xc:
      pSVar14 = (STRING_POOL *)0x11;
LAB_0045c579:
      cVar19 = '\x01';
      break;
    case 0xd:
      iVar6 = reportComment(parser,enc,local_c8,local_c0);
LAB_0045bd02:
      if (iVar6 == 0) {
        cVar19 = '\x01';
        pSVar14 = (STRING_POOL *)0x1;
        break;
      }
      goto LAB_0045c548;
    case -5:
      if (haveMore != '\0') goto LAB_0045c56c;
      if (parser->m_characterDataHandler == (XML_CharacterDataHandler)0x0) {
        if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
          reportDefault(parser,enc,local_c8,end);
        }
      }
      else if (enc->isUtf8 == '\0') {
        local_90.str = parser->m_dataBuf;
        (*enc->utf8Convert)(enc,&local_c8,end,&local_90.str,parser->m_dataBufEnd);
        (*parser->m_characterDataHandler)
                  (parser->m_handlerArg,parser->m_dataBuf,(int)local_90.str - (int)parser->m_dataBuf
                  );
      }
      else {
        (*parser->m_characterDataHandler)(parser->m_handlerArg,local_c8,(int)end - (int)local_c8);
      }
      if (local_a4 == 0) {
        pOVar18->internalEventPtr = end;
LAB_0045c3b2:
        pSVar14 = (STRING_POOL *)0x3;
        goto LAB_0045c579;
      }
      if (parser->m_tagLevel != local_a4) {
        pOVar18->internalEventPtr = end;
        pSVar14 = (STRING_POOL *)0xd;
        goto LAB_0045c579;
      }
      *nextPtr = end;
      goto LAB_0045c570;
    case -4:
      if (haveMore != '\0') goto LAB_0045c56c;
      if (local_a4 < 1) goto LAB_0045c3b2;
      pSVar14 = (STRING_POOL *)0xd;
      cVar19 = '\x01';
      if (parser->m_tagLevel == local_a4) {
        *nextPtr = local_c8;
LAB_0045c26c:
        cVar19 = '\x01';
        pSVar14 = (STRING_POOL *)0x0;
      }
      break;
    case -3:
      if (haveMore != '\0') goto LAB_0045c56c;
      *local_a0 = end;
      if (parser->m_characterDataHandler == (XML_CharacterDataHandler)0x0) {
        if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
          reportDefault(parser,enc,local_c8,end);
        }
      }
      else {
        local_90.str = (XML_Char *)CONCAT71(local_90.str._1_7_,10);
        (*parser->m_characterDataHandler)(parser->m_handlerArg,(XML_Char *)&local_90,1);
      }
      if (local_a4 == 0) goto LAB_0045c3b2;
      pSVar14 = (STRING_POOL *)0xd;
      cVar19 = '\x01';
      if (parser->m_tagLevel == local_a4) {
        *nextPtr = end;
        goto LAB_0045c26c;
      }
      break;
    case -2:
      if (haveMore != '\0') goto LAB_0045c56c;
      pSVar14 = (STRING_POOL *)0x6;
      goto LAB_0045c579;
    case -1:
      if (haveMore != '\0') goto LAB_0045c56c;
      pSVar14 = (STRING_POOL *)0x5;
      goto LAB_0045c579;
    }
    pSVar10 = pSVar14;
    if (cVar19 != '\0') {
      return (XML_Error)pSVar14;
    }
  } while( true );
}

Assistant:

static enum XML_Error
doContent(XML_Parser parser,
          int startTagLevel,
          const ENCODING *enc,
          const char *s,
          const char *end,
          const char **nextPtr,
          XML_Bool haveMore)
{
  /* save one level of indirection */
  DTD * const dtd = parser->m_dtd;

  const char **eventPP;
  const char **eventEndPP;
  if (enc == parser->m_encoding) {
    eventPP = &parser->m_eventPtr;
    eventEndPP = &parser->m_eventEndPtr;
  }
  else {
    eventPP = &(parser->m_openInternalEntities->internalEventPtr);
    eventEndPP = &(parser->m_openInternalEntities->internalEventEndPtr);
  }
  *eventPP = s;

  for (;;) {
    const char *next = s; /* XmlContentTok doesn't always set the last arg */
    int tok = XmlContentTok(enc, s, end, &next);
    *eventEndPP = next;
    switch (tok) {
    case XML_TOK_TRAILING_CR:
      if (haveMore) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      *eventEndPP = end;
      if (parser->m_characterDataHandler) {
        XML_Char c = 0xA;
        parser->m_characterDataHandler(parser->m_handlerArg, &c, 1);
      }
      else if (parser->m_defaultHandler)
        reportDefault(parser, enc, s, end);
      /* We are at the end of the final buffer, should we check for
         XML_SUSPENDED, XML_FINISHED?
      */
      if (startTagLevel == 0)
        return XML_ERROR_NO_ELEMENTS;
      if (parser->m_tagLevel != startTagLevel)
        return XML_ERROR_ASYNC_ENTITY;
      *nextPtr = end;
      return XML_ERROR_NONE;
    case XML_TOK_NONE:
      if (haveMore) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      if (startTagLevel > 0) {
        if (parser->m_tagLevel != startTagLevel)
          return XML_ERROR_ASYNC_ENTITY;
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_NO_ELEMENTS;
    case XML_TOK_INVALID:
      *eventPP = next;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL:
      if (haveMore) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_UNCLOSED_TOKEN;
    case XML_TOK_PARTIAL_CHAR:
      if (haveMore) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_PARTIAL_CHAR;
    case XML_TOK_ENTITY_REF:
      {
        const XML_Char *name;
        ENTITY *entity;
        XML_Char ch = (XML_Char) XmlPredefinedEntityName(enc,
                                              s + enc->minBytesPerChar,
                                              next - enc->minBytesPerChar);
        if (ch) {
          if (parser->m_characterDataHandler)
            parser->m_characterDataHandler(parser->m_handlerArg, &ch, 1);
          else if (parser->m_defaultHandler)
            reportDefault(parser, enc, s, next);
          break;
        }
        name = poolStoreString(&dtd->pool, enc,
                                s + enc->minBytesPerChar,
                                next - enc->minBytesPerChar);
        if (!name)
          return XML_ERROR_NO_MEMORY;
        entity = (ENTITY *)lookup(parser, &dtd->generalEntities, name, 0);
        poolDiscard(&dtd->pool);
        /* First, determine if a check for an existing declaration is needed;
           if yes, check that the entity exists, and that it is internal,
           otherwise call the skipped entity or default handler.
        */
        if (!dtd->hasParamEntityRefs || dtd->standalone) {
          if (!entity)
            return XML_ERROR_UNDEFINED_ENTITY;
          else if (!entity->is_internal)
            return XML_ERROR_ENTITY_DECLARED_IN_PE;
        }
        else if (!entity) {
          if (parser->m_skippedEntityHandler)
            parser->m_skippedEntityHandler(parser->m_handlerArg, name, 0);
          else if (parser->m_defaultHandler)
            reportDefault(parser, enc, s, next);
          break;
        }
        if (entity->open)
          return XML_ERROR_RECURSIVE_ENTITY_REF;
        if (entity->notation)
          return XML_ERROR_BINARY_ENTITY_REF;
        if (entity->textPtr) {
          enum XML_Error result;
          if (!parser->m_defaultExpandInternalEntities) {
            if (parser->m_skippedEntityHandler)
              parser->m_skippedEntityHandler(parser->m_handlerArg, entity->name, 0);
            else if (parser->m_defaultHandler)
              reportDefault(parser, enc, s, next);
            break;
          }
          result = processInternalEntity(parser, entity, XML_FALSE);
          if (result != XML_ERROR_NONE)
            return result;
        }
        else if (parser->m_externalEntityRefHandler) {
          const XML_Char *context;
          entity->open = XML_TRUE;
          context = getContext(parser);
          entity->open = XML_FALSE;
          if (!context)
            return XML_ERROR_NO_MEMORY;
          if (!parser->m_externalEntityRefHandler(parser->m_externalEntityRefHandlerArg,
                                        context,
                                        entity->base,
                                        entity->systemId,
                                        entity->publicId))
            return XML_ERROR_EXTERNAL_ENTITY_HANDLING;
          poolDiscard(&parser->m_tempPool);
        }
        else if (parser->m_defaultHandler)
          reportDefault(parser, enc, s, next);
        break;
      }
    case XML_TOK_START_TAG_NO_ATTS:
      /* fall through */
    case XML_TOK_START_TAG_WITH_ATTS:
      {
        TAG *tag;
        enum XML_Error result;
        XML_Char *toPtr;
        if (parser->m_freeTagList) {
          tag = parser->m_freeTagList;
          parser->m_freeTagList = parser->m_freeTagList->parent;
        }
        else {
          tag = (TAG *)MALLOC(parser, sizeof(TAG));
          if (!tag)
            return XML_ERROR_NO_MEMORY;
          tag->buf = (char *)MALLOC(parser, INIT_TAG_BUF_SIZE);
          if (!tag->buf) {
            FREE(parser, tag);
            return XML_ERROR_NO_MEMORY;
          }
          tag->bufEnd = tag->buf + INIT_TAG_BUF_SIZE;
        }
        tag->bindings = NULL;
        tag->parent = parser->m_tagStack;
        parser->m_tagStack = tag;
        tag->name.localPart = NULL;
        tag->name.prefix = NULL;
        tag->rawName = s + enc->minBytesPerChar;
        tag->rawNameLength = XmlNameLength(enc, tag->rawName);
        ++parser->m_tagLevel;
        {
          const char *rawNameEnd = tag->rawName + tag->rawNameLength;
          const char *fromPtr = tag->rawName;
          toPtr = (XML_Char *)tag->buf;
          for (;;) {
            int bufSize;
            int convLen;
            const enum XML_Convert_Result convert_res = XmlConvert(enc,
                       &fromPtr, rawNameEnd,
                       (ICHAR **)&toPtr, (ICHAR *)tag->bufEnd - 1);
            convLen = (int)(toPtr - (XML_Char *)tag->buf);
            if ((fromPtr >= rawNameEnd) || (convert_res == XML_CONVERT_INPUT_INCOMPLETE)) {
              tag->name.strLen = convLen;
              break;
            }
            bufSize = (int)(tag->bufEnd - tag->buf) << 1;
            {
              char *temp = (char *)REALLOC(parser, tag->buf, bufSize);
              if (temp == NULL)
                return XML_ERROR_NO_MEMORY;
              tag->buf = temp;
              tag->bufEnd = temp + bufSize;
              toPtr = (XML_Char *)temp + convLen;
            }
          }
        }
        tag->name.str = (XML_Char *)tag->buf;
        *toPtr = XML_T('\0');
        result = storeAtts(parser, enc, s, &(tag->name), &(tag->bindings));
        if (result)
          return result;
        if (parser->m_startElementHandler)
          parser->m_startElementHandler(parser->m_handlerArg, tag->name.str,
                              (const XML_Char **)parser->m_atts);
        else if (parser->m_defaultHandler)
          reportDefault(parser, enc, s, next);
        poolClear(&parser->m_tempPool);
        break;
      }
    case XML_TOK_EMPTY_ELEMENT_NO_ATTS:
      /* fall through */
    case XML_TOK_EMPTY_ELEMENT_WITH_ATTS:
      {
        const char *rawName = s + enc->minBytesPerChar;
        enum XML_Error result;
        BINDING *bindings = NULL;
        XML_Bool noElmHandlers = XML_TRUE;
        TAG_NAME name;
        name.str = poolStoreString(&parser->m_tempPool, enc, rawName,
                                   rawName + XmlNameLength(enc, rawName));
        if (!name.str)
          return XML_ERROR_NO_MEMORY;
        poolFinish(&parser->m_tempPool);
        result = storeAtts(parser, enc, s, &name, &bindings);
        if (result != XML_ERROR_NONE) {
          freeBindings(parser, bindings);
          return result;
        }
        poolFinish(&parser->m_tempPool);
        if (parser->m_startElementHandler) {
          parser->m_startElementHandler(parser->m_handlerArg, name.str, (const XML_Char **)parser->m_atts);
          noElmHandlers = XML_FALSE;
        }
        if (parser->m_endElementHandler) {
          if (parser->m_startElementHandler)
            *eventPP = *eventEndPP;
          parser->m_endElementHandler(parser->m_handlerArg, name.str);
          noElmHandlers = XML_FALSE;
        }
        if (noElmHandlers && parser->m_defaultHandler)
          reportDefault(parser, enc, s, next);
        poolClear(&parser->m_tempPool);
        freeBindings(parser, bindings);
      }
      if ((parser->m_tagLevel == 0) && (parser->m_parsingStatus.parsing != XML_FINISHED)) {
        if (parser->m_parsingStatus.parsing == XML_SUSPENDED)
          parser->m_processor = epilogProcessor;
        else
          return epilogProcessor(parser, next, end, nextPtr);
      }
      break;
    case XML_TOK_END_TAG:
      if (parser->m_tagLevel == startTagLevel)
        return XML_ERROR_ASYNC_ENTITY;
      else {
        int len;
        const char *rawName;
        TAG *tag = parser->m_tagStack;
        parser->m_tagStack = tag->parent;
        tag->parent = parser->m_freeTagList;
        parser->m_freeTagList = tag;
        rawName = s + enc->minBytesPerChar*2;
        len = XmlNameLength(enc, rawName);
        if (len != tag->rawNameLength
            || memcmp(tag->rawName, rawName, len) != 0) {
          *eventPP = rawName;
          return XML_ERROR_TAG_MISMATCH;
        }
        --parser->m_tagLevel;
        if (parser->m_endElementHandler) {
          const XML_Char *localPart;
          const XML_Char *prefix;
          XML_Char *uri;
          localPart = tag->name.localPart;
          if (parser->m_ns && localPart) {
            /* localPart and prefix may have been overwritten in
               tag->name.str, since this points to the binding->uri
               buffer which gets re-used; so we have to add them again
            */
            uri = (XML_Char *)tag->name.str + tag->name.uriLen;
            /* don't need to check for space - already done in storeAtts() */
            while (*localPart) *uri++ = *localPart++;
            prefix = (XML_Char *)tag->name.prefix;
            if (parser->m_ns_triplets && prefix) {
              *uri++ = parser->m_namespaceSeparator;
              while (*prefix) *uri++ = *prefix++;
             }
            *uri = XML_T('\0');
          }
          parser->m_endElementHandler(parser->m_handlerArg, tag->name.str);
        }
        else if (parser->m_defaultHandler)
          reportDefault(parser, enc, s, next);
        while (tag->bindings) {
          BINDING *b = tag->bindings;
          if (parser->m_endNamespaceDeclHandler)
            parser->m_endNamespaceDeclHandler(parser->m_handlerArg, b->prefix->name);
          tag->bindings = tag->bindings->nextTagBinding;
          b->nextTagBinding = parser->m_freeBindingList;
          parser->m_freeBindingList = b;
          b->prefix->binding = b->prevPrefixBinding;
        }
        if (parser->m_tagLevel == 0)
          return epilogProcessor(parser, next, end, nextPtr);
      }
      break;
    case XML_TOK_CHAR_REF:
      {
        int n = XmlCharRefNumber(enc, s);
        if (n < 0)
          return XML_ERROR_BAD_CHAR_REF;
        if (parser->m_characterDataHandler) {
          XML_Char buf[XML_ENCODE_MAX];
          parser->m_characterDataHandler(parser->m_handlerArg, buf, XmlEncode(n, (ICHAR *)buf));
        }
        else if (parser->m_defaultHandler)
          reportDefault(parser, enc, s, next);
      }
      break;
    case XML_TOK_XML_DECL:
      return XML_ERROR_MISPLACED_XML_PI;
    case XML_TOK_DATA_NEWLINE:
      if (parser->m_characterDataHandler) {
        XML_Char c = 0xA;
        parser->m_characterDataHandler(parser->m_handlerArg, &c, 1);
      }
      else if (parser->m_defaultHandler)
        reportDefault(parser, enc, s, next);
      break;
    case XML_TOK_CDATA_SECT_OPEN:
      {
        enum XML_Error result;
        if (parser->m_startCdataSectionHandler)
          parser->m_startCdataSectionHandler(parser->m_handlerArg);
/* BEGIN disabled code */
        /* Suppose you doing a transformation on a document that involves
           changing only the character data.  You set up a defaultHandler
           and a characterDataHandler.  The defaultHandler simply copies
           characters through.  The characterDataHandler does the
           transformation and writes the characters out escaping them as
           necessary.  This case will fail to work if we leave out the
           following two lines (because & and < inside CDATA sections will
           be incorrectly escaped).

           However, now we have a start/endCdataSectionHandler, so it seems
           easier to let the user deal with this.
        */
        else if (0 && parser->m_characterDataHandler)
          parser->m_characterDataHandler(parser->m_handlerArg, parser->m_dataBuf, 0);
/* END disabled code */
        else if (parser->m_defaultHandler)
          reportDefault(parser, enc, s, next);
        result = doCdataSection(parser, enc, &next, end, nextPtr, haveMore);
        if (result != XML_ERROR_NONE)
          return result;
        else if (!next) {
          parser->m_processor = cdataSectionProcessor;
          return result;
        }
      }
      break;
    case XML_TOK_TRAILING_RSQB:
      if (haveMore) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      if (parser->m_characterDataHandler) {
        if (MUST_CONVERT(enc, s)) {
          ICHAR *dataPtr = (ICHAR *)parser->m_dataBuf;
          XmlConvert(enc, &s, end, &dataPtr, (ICHAR *)parser->m_dataBufEnd);
          parser->m_characterDataHandler(parser->m_handlerArg, parser->m_dataBuf,
                               (int)(dataPtr - (ICHAR *)parser->m_dataBuf));
        }
        else
          parser->m_characterDataHandler(parser->m_handlerArg,
                               (XML_Char *)s,
                               (int)((XML_Char *)end - (XML_Char *)s));
      }
      else if (parser->m_defaultHandler)
        reportDefault(parser, enc, s, end);
      /* We are at the end of the final buffer, should we check for
         XML_SUSPENDED, XML_FINISHED?
      */
      if (startTagLevel == 0) {
        *eventPP = end;
        return XML_ERROR_NO_ELEMENTS;
      }
      if (parser->m_tagLevel != startTagLevel) {
        *eventPP = end;
        return XML_ERROR_ASYNC_ENTITY;
      }
      *nextPtr = end;
      return XML_ERROR_NONE;
    case XML_TOK_DATA_CHARS:
      {
        XML_CharacterDataHandler charDataHandler = parser->m_characterDataHandler;
        if (charDataHandler) {
          if (MUST_CONVERT(enc, s)) {
            for (;;) {
              ICHAR *dataPtr = (ICHAR *)parser->m_dataBuf;
              const enum XML_Convert_Result convert_res = XmlConvert(enc, &s, next, &dataPtr, (ICHAR *)parser->m_dataBufEnd);
              *eventEndPP = s;
              charDataHandler(parser->m_handlerArg, parser->m_dataBuf,
                              (int)(dataPtr - (ICHAR *)parser->m_dataBuf));
              if ((convert_res == XML_CONVERT_COMPLETED) || (convert_res == XML_CONVERT_INPUT_INCOMPLETE))
                break;
              *eventPP = s;
            }
          }
          else
            charDataHandler(parser->m_handlerArg,
                            (XML_Char *)s,
                            (int)((XML_Char *)next - (XML_Char *)s));
        }
        else if (parser->m_defaultHandler)
          reportDefault(parser, enc, s, next);
      }
      break;
    case XML_TOK_PI:
      if (!reportProcessingInstruction(parser, enc, s, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_COMMENT:
      if (!reportComment(parser, enc, s, next))
        return XML_ERROR_NO_MEMORY;
      break;
    default:
      /* All of the tokens produced by XmlContentTok() have their own
       * explicit cases, so this default is not strictly necessary.
       * However it is a useful safety net, so we retain the code and
       * simply exclude it from the coverage tests.
       *
       * LCOV_EXCL_START
       */
      if (parser->m_defaultHandler)
        reportDefault(parser, enc, s, next);
      break;
      /* LCOV_EXCL_STOP */
    }
    *eventPP = s = next;
    switch (parser->m_parsingStatus.parsing) {
    case XML_SUSPENDED:
      *nextPtr = next;
      return XML_ERROR_NONE;
    case XML_FINISHED:
      return XML_ERROR_ABORTED;
    default: ;
    }
  }
  /* not reached */
}